

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

QIcon __thiscall QFusionStyle::iconFromTheme(QFusionStyle *this,StandardPixmap standardIcon)

{
  int in_EDX;
  char16_t *pcVar1;
  anon_class_1_0_00000001 *this_00;
  QStringView prefix;
  
  *(undefined1 **)&(this->super_QCommonStyle).super_QStyle = &DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon((QIcon *)this);
  if (in_EDX - 1U < 8) {
    switch(in_EDX) {
    case 1:
      pcVar1 = L"fusion_titlebar-min-";
      this_00 = (anon_class_1_0_00000001 *)0x14;
      break;
    default:
      goto switchD_003bbac1_caseD_2;
    case 3:
    case 8:
      pcVar1 = L"fusion_closedock-";
      this_00 = (anon_class_1_0_00000001 *)0x11;
      break;
    case 4:
      pcVar1 = L"fusion_normalizedockup-";
      this_00 = (anon_class_1_0_00000001 *)0x17;
    }
    prefix.m_data = (storage_type_conflict *)this;
    prefix.m_size = (qsizetype)pcVar1;
    iconFromTheme::anon_class_1_0_00000001::operator()
              (this_00,prefix,
               (QIcon *)((long)&switchD_003bbac1::switchdataD_006d0114 +
                        (long)(int)(&switchD_003bbac1::switchdataD_006d0114)[in_EDX - 1U]));
  }
switchD_003bbac1_caseD_2:
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QFusionStyle::iconFromTheme(StandardPixmap standardIcon) const
{
    QIcon icon;
#if QT_CONFIG(imageformat_png)
    auto addIconFiles = [](QStringView prefix, QIcon &icon)
    {
        const auto fullPrefix = QStringLiteral(":/qt-project.org/styles/fusionstyle/images/") + prefix;
        static constexpr auto dockTitleIconSizes = {10, 16, 20, 32, 48, 64};
        for (int size : dockTitleIconSizes)
            icon.addFile(fullPrefix + QString::number(size) + QStringLiteral(".png"),
                         QSize(size, size));
    };
    switch (standardIcon) {
    case SP_TitleBarNormalButton:
        addIconFiles(u"fusion_normalizedockup-", icon);
      break;
    case SP_TitleBarMinButton:
        addIconFiles(u"fusion_titlebar-min-", icon);
        break;
    case SP_TitleBarCloseButton:
    case SP_DockWidgetCloseButton:
        addIconFiles(u"fusion_closedock-", icon);
        break;
    default:
        break;
    }
#else  // imageformat_png
    Q_UNUSED(standardIcon);
#endif // imageformat_png
    return icon;
}